

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O1

void __thiscall wasm::PassRunner::run(PassRunner *this)

{
  PassRunner **ppPVar1;
  pointer puVar2;
  Pass *pPVar3;
  pointer puVar4;
  Function *func;
  int iVar5;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_1;
  PassOptions *pPVar6;
  ostream *poVar7;
  long lVar8;
  PassOptions *pPVar9;
  ulong uVar10;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass;
  pointer puVar11;
  char *pcVar12;
  long lVar13;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  ulong uVar14;
  pointer puVar15;
  bool bVar16;
  string_view sVar17;
  undefined1 auStack_398 [8];
  vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> stack;
  ios_base local_318 [264];
  undefined1 local_210 [8];
  anon_class_16_2_032a43cd flush;
  _Head_base<0UL,_wasm::Pass_*,_false> local_88;
  long local_80;
  double local_68;
  pointer local_60;
  char *local_58;
  long local_50;
  double local_48;
  PassOptions *local_40;
  PassRunner *local_38;
  
  if (run()::passDebug == '\0') {
    run();
  }
  local_38 = this;
  if ((run::passDebug == 2 || (this->options).debug != false) ||
     ((run::passDebug != 0 && (this->isNested == false)))) {
    pcVar12 = "passes";
    bVar16 = this->isNested != false;
    if (bVar16) {
      pcVar12 = "nested passes";
    }
    lVar13 = 6;
    if (bVar16) {
      lVar13 = 0xd;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"[PassRunner] running ",0x15);
    local_58 = pcVar12;
    local_50 = lVar13;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,lVar13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    pPVar6 = (PassOptions *)
             (this->passes).
             super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar9 = (PassOptions *)
             (this->passes).
             super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar6 == pPVar9) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0;
      do {
        uVar14 = *(ulong *)((long)*(__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>
                                    *)pPVar6 + 0x18);
        if (*(ulong *)((long)*(__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>
                               *)pPVar6 + 0x18) < uVar10) {
          uVar14 = uVar10;
        }
        uVar10 = uVar14;
        pPVar6 = (PassOptions *)&pPVar6->shrinkLevel;
      } while (pPVar6 != pPVar9);
    }
    local_40 = &this->options;
    if ((2 < run::passDebug) && (this->isNested == false)) {
      sVar17 = IString::interned((IString *)0x6,(string_view)ZEXT816(0xe16b08),SUB81(pPVar9,0));
      pPVar9 = local_40;
      dumpWasm((Name)sVar17,this->wasm,local_40);
    }
    puVar11 = (this->passes).
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_60 = (this->passes).
               super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar11 == local_60) {
      local_48 = 0.0;
    }
    else {
      local_48 = 0.0;
      do {
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_398);
        if ((run::passDebug == 2) && (this->isNested == false)) {
          poVar7 = std::operator<<((ostream *)
                                   &stack.
                                    super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish,this->wasm);
          local_210[0] = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_210,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"[PassRunner]   running pass: ",0x1d);
        pPVar3 = (puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                 ._M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                 super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(pPVar3->name)._M_dataplus._M_p,
                            (pPVar3->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"... ",4);
        if (uVar10 != (((puVar11->_M_t).
                        super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                        super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                        super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name).
                      _M_string_length) {
          uVar14 = 0;
          do {
            local_210[0] = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_210,1);
            uVar14 = uVar14 + 1;
            pPVar9 = (PassOptions *)
                     (uVar10 - (((puVar11->_M_t).
                                 super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                 .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name).
                               _M_string_length);
          } while (uVar14 < pPVar9);
        }
        lVar13 = std::chrono::_V2::steady_clock::now();
        iVar5 = (*((puVar11->_M_t).
                   super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
        if ((char)iVar5 == '\0') {
          runPass(local_38,(puVar11->_M_t).
                           super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                           super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
        }
        else {
          puVar4 = (local_38->wasm->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar15 = (local_38->wasm->functions).
                         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar4;
              puVar15 = puVar15 + 1) {
            func = (puVar15->_M_t).
                   super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                   super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
            if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
              runPassOnFunction(local_38,(puVar11->_M_t).
                                         super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>
                                         .super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl,
                                func);
            }
          }
        }
        lVar8 = std::chrono::_V2::steady_clock::now();
        local_68 = (double)(lVar8 - lVar13) / 1000000000.0;
        poVar7 = std::ostream::_M_insert<double>(local_68);
        this = local_38;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," seconds.",9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        if (((this->options).validate == true) && (this->isNested == false)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"[PassRunner]   (validating)\n",0x1c);
          bVar16 = WasmValidator::validate((WasmValidator *)local_210,this->wasm,local_40);
          if (!bVar16) {
            poVar7 = std::operator<<((ostream *)&std::cout,this->wasm);
            local_210[0] = 10;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,local_210,1);
            if (run::passDebug < 2) {
              Fatal::Fatal((Fatal *)local_210);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&flush.this,"Last pass (",0xb);
              pPVar3 = (puVar11->_M_t).
                       super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&flush.this,(pPVar3->name)._M_dataplus._M_p,
                         (pPVar3->name)._M_string_length);
              Fatal::operator<<((Fatal *)local_210,
                                (char (*) [128])
                                ") broke validation. Run with BINARYEN_PASS_DEBUG=2 in the env to see the earlier state, or 3 to dump byn-* files for each pass\n"
                               );
            }
            else {
              Fatal::Fatal((Fatal *)local_210);
              ppPVar1 = &flush.this;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)ppPVar1,"Last pass (",0xb);
              pPVar3 = (puVar11->_M_t).
                       super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)ppPVar1,(pPVar3->name)._M_dataplus._M_p,
                         (pPVar3->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)ppPVar1,") broke validation. Here is the module before: \n",0x30
                        );
              std::__cxx11::stringbuf::str();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)ppPVar1,(char *)local_88._M_head_impl,local_80);
              Fatal::operator<<((Fatal *)local_210,(char (*) [2])0xe5017f);
              std::__cxx11::string::~string((string *)&local_88);
            }
            Fatal::~Fatal((Fatal *)local_210);
          }
        }
        if (2 < run::passDebug) {
          pPVar3 = (puVar11->_M_t).
                   super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
          sVar17._M_str = (char *)0x0;
          sVar17._M_len = (size_t)(pPVar3->name)._M_dataplus._M_p;
          sVar17 = IString::interned((IString *)(pPVar3->name)._M_string_length,sVar17,
                                     SUB81(pPVar9,0));
          pPVar9 = local_40;
          dumpWasm((Name)sVar17,this->wasm,local_40);
        }
        local_48 = local_48 + local_68;
        std::__cxx11::stringstream::~stringstream((stringstream *)auStack_398);
        std::ios_base::~ios_base(local_318);
        puVar11 = puVar11 + 1;
      } while (puVar11 != local_60);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[PassRunner] ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_58,local_50);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," took ",6);
    poVar7 = std::ostream::_M_insert<double>(local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," seconds.",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    if (((this->options).validate != false) && (this->isNested == false)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"[PassRunner] (final validation)\n",0x20);
      bVar16 = WasmValidator::validate((WasmValidator *)auStack_398,this->wasm,local_40);
      if (!bVar16) {
        poVar7 = std::operator<<((ostream *)&std::cout,this->wasm);
        auStack_398[0] = (stringstream)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,auStack_398,1);
        Fatal::Fatal((Fatal *)auStack_398);
        Fatal::operator<<((Fatal *)auStack_398,(char (*) [32])"final module does not validate\n");
        Fatal::~Fatal((Fatal *)auStack_398);
      }
    }
  }
  else {
    local_210 = (undefined1  [8])auStack_398;
    auStack_398 = (undefined1  [8])0x0;
    stack.super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    stack.super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar11 = (this->passes).
              super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->passes).
             super__Vector_base<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>,_std::allocator<std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    flush.stack = (vector<wasm::Pass_*,_std::allocator<wasm::Pass_*>_> *)this;
    if (puVar11 != puVar2) {
      do {
        iVar5 = (*((puVar11->_M_t).
                   super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                   super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[4])();
        if ((char)iVar5 == '\0') {
          run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_210);
          runPass(local_38,(puVar11->_M_t).
                           super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                           super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                           super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl);
        }
        else {
          local_88._M_head_impl =
               (puVar11->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>.
               _M_t.super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
          std::vector<wasm::Pass*,std::allocator<wasm::Pass*>>::emplace_back<wasm::Pass*>
                    ((vector<wasm::Pass*,std::allocator<wasm::Pass*>> *)auStack_398,
                     &local_88._M_head_impl);
        }
        puVar11 = puVar11 + 1;
      } while (puVar11 != puVar2);
    }
    run::anon_class_16_2_032a43cd::operator()((anon_class_16_2_032a43cd *)local_210);
    if (auStack_398 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_398,
                      (long)stack.super__Vector_base<wasm::Pass_*,_std::allocator<wasm::Pass_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_398);
    }
  }
  return;
}

Assistant:

void PassRunner::run() {
  static const int passDebug = getPassDebug();
  // Emit logging information when asked for. At passDebug level 1+ we log
  // the main passes, while in 2 we also log nested ones. Note that for
  // nested ones we can only emit their name - we can't validate, or save the
  // file, or print, as the wasm may be in an intermediate state that is not
  // valid.
  if (options.debug || (passDebug == 2 || (passDebug && !isNested))) {
    // for debug logging purposes, run each pass in full before running the
    // other
    auto totalTime = std::chrono::duration<double>(0);
    auto what = isNested ? "nested passes" : "passes";
    std::cerr << "[PassRunner] running " << what << std::endl;
    size_t padding = 0;
    for (auto& pass : passes) {
      padding = std::max(padding, pass->name.size());
    }
    if (passDebug >= 3 && !isNested) {
      dumpWasm("before", wasm, options);
    }
    for (auto& pass : passes) {
      // ignoring the time, save a printout of the module before, in case this
      // pass breaks it, so we can print the before and after
      std::stringstream moduleBefore;
      if (passDebug == 2 && !isNested) {
        moduleBefore << *wasm << '\n';
      }
      // prepare to run
      std::cerr << "[PassRunner]   running pass: " << pass->name << "... ";
      for (size_t i = 0; i < padding - pass->name.size(); i++) {
        std::cerr << ' ';
      }
      auto before = std::chrono::steady_clock::now();
      if (pass->isFunctionParallel()) {
        // function-parallel passes should get a new instance per function
        ModuleUtils::iterDefinedFunctions(
          *wasm, [&](Function* func) { runPassOnFunction(pass.get(), func); });
      } else {
        runPass(pass.get());
      }
      auto after = std::chrono::steady_clock::now();
      std::chrono::duration<double> diff = after - before;
      std::cerr << diff.count() << " seconds." << std::endl;
      totalTime += diff;
      if (options.validate && !isNested) {
        // validate, ignoring the time
        std::cerr << "[PassRunner]   (validating)\n";
        if (!WasmValidator().validate(*wasm, options)) {
          std::cout << *wasm << '\n';
          if (passDebug >= 2) {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Here is the module before: \n"
                    << moduleBefore.str() << "\n";
          } else {
            Fatal() << "Last pass (" << pass->name
                    << ") broke validation. Run with BINARYEN_PASS_DEBUG=2 "
                       "in the env to see the earlier state, or 3 to dump "
                       "byn-* files for each pass\n";
          }
        }
      }
      if (passDebug >= 3) {
        dumpWasm(pass->name, wasm, options);
      }
    }
    std::cerr << "[PassRunner] " << what << " took " << totalTime.count()
              << " seconds." << std::endl;
    if (options.validate && !isNested) {
      std::cerr << "[PassRunner] (final validation)\n";
      if (!WasmValidator().validate(*wasm, options)) {
        std::cout << *wasm << '\n';
        Fatal() << "final module does not validate\n";
      }
    }
  } else {
    // non-debug normal mode, run them in an optimal manner - for locality it is
    // better to run as many passes as possible on a single function before
    // moving to the next
    std::vector<Pass*> stack;
    auto flush = [&]() {
      if (stack.size() > 0) {
        // run the stack of passes on all the functions, in parallel
        size_t num = ThreadPool::get()->size();
        std::vector<std::function<ThreadWorkState()>> doWorkers;
        std::atomic<size_t> nextFunction;
        nextFunction.store(0);
        size_t numFunctions = wasm->functions.size();
        for (size_t i = 0; i < num; i++) {
          doWorkers.push_back([&]() {
            auto index = nextFunction.fetch_add(1);
            // get the next task, if there is one
            if (index >= numFunctions) {
              return ThreadWorkState::Finished; // nothing left
            }
            Function* func = this->wasm->functions[index].get();
            if (!func->imported()) {
              // do the current task: run all passes on this function
              for (auto* pass : stack) {
                runPassOnFunction(pass, func);
              }
            }
            if (index + 1 == numFunctions) {
              return ThreadWorkState::Finished; // we did the last one
            }
            return ThreadWorkState::More;
          });
        }
        ThreadPool::get()->work(doWorkers);
      }
      stack.clear();
    };
    for (auto& pass : passes) {
      if (pass->isFunctionParallel()) {
        stack.push_back(pass.get());
      } else {
        flush();
        runPass(pass.get());
      }
    }
    flush();
  }
}